

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

int __thiscall CaDiCaL::Internal::find_conflict_level(Internal *this,int *forced)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  pointer pVVar4;
  Clause *pCVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint *puVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  uint *puVar20;
  
  *forced = 0;
  pVVar4 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar5 = this->conflict;
  iVar1 = pCVar5->size;
  iVar17 = 0;
  iVar14 = 0;
  for (lVar9 = 0; iVar16 = iVar17, (long)iVar1 * 4 != lVar9; lVar9 = lVar9 + 4) {
    uVar2 = *(uint *)((long)&pCVar5[1].field_0 + lVar9);
    uVar7 = -uVar2;
    if (0 < (int)uVar2) {
      uVar7 = uVar2;
    }
    iVar16 = pVVar4[uVar7].level;
    if (iVar14 < iVar16) {
      *forced = uVar2;
      iVar14 = iVar16;
      iVar17 = 1;
    }
    else if ((iVar16 == iVar14) &&
            (iVar16 = iVar17 + 1, bVar6 = 0 < iVar17, iVar17 = iVar16,
            bVar6 && iVar14 == this->level)) break;
  }
  iVar1 = pCVar5->size;
  puVar20 = (uint *)((long)&pCVar5[1].field_0 + 4);
  uVar13 = 1;
  uVar19 = 0;
  do {
    if (uVar19 == 2) {
      if (iVar16 != 1) {
        *forced = 0;
      }
      return iVar14;
    }
    uVar2 = *(uint *)((long)&pCVar5[1].field_0 + uVar19 * 4);
    uVar7 = -uVar2;
    if (0 < (int)uVar2) {
      uVar7 = uVar2;
    }
    pVVar4 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar17 = pVVar4[uVar7].level;
    uVar12 = uVar19 & 0xffffffff;
    puVar15 = puVar20;
    uVar18 = uVar2;
    for (uVar10 = uVar13; uVar11 = (uint)uVar12, (long)uVar10 < (long)iVar1; uVar10 = uVar10 + 1) {
      uVar11 = *puVar15;
      uVar8 = -uVar11;
      if (0 < (int)uVar11) {
        uVar8 = uVar11;
      }
      iVar3 = pVVar4[uVar8].level;
      if (iVar17 < iVar3) {
        uVar18 = uVar11;
        if (iVar3 == iVar14) {
          uVar11 = (uint)uVar10;
          break;
        }
        uVar12 = uVar10 & 0xffffffff;
        iVar17 = iVar3;
      }
      puVar15 = puVar15 + 1;
    }
    if (uVar19 != uVar11) {
      if ((int)uVar11 < 2) {
        *(uint *)((long)&pCVar5[1].field_0 + (long)(int)uVar11 * 4) = uVar2;
        *(uint *)((long)&pCVar5[1].field_0 + uVar19 * 4) = uVar18;
      }
      else {
        remove_watch((this->wtab).
                     super__Vector_base<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>,_std::allocator<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (uVar7 << 1 | uVar2 >> 0x1f),
                     this->conflict);
        *(uint *)((long)&pCVar5[1].field_0 + (ulong)uVar11 * 4) = uVar2;
        *(uint *)((long)&pCVar5[1].field_0 + uVar19 * 4) = uVar18;
        watch_literal(this,uVar18,*(int *)((long)&pCVar5[1].field_0 + (uVar19 & 0xffffffff ^ 1) * 4)
                      ,this->conflict);
      }
    }
    uVar13 = uVar13 + 1;
    puVar20 = puVar20 + 1;
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

inline int Internal::find_conflict_level (int &forced) {

  assert (conflict);
  assert (opts.chrono || opts.otfs || external_prop);

  int res = 0, count = 0;

  forced = 0;

  for (const auto &lit : *conflict) {
    const int tmp = var (lit).level;
    if (tmp > res) {
      res = tmp;
      forced = lit;
      count = 1;
    } else if (tmp == res) {
      count++;
      if (res == level && count > 1)
        break;
    }
  }

  LOG ("%d literals on actual conflict level %d", count, res);

  const int size = conflict->size;
  int *lits = conflict->literals;

  // Move the two highest level literals to the front.
  //
  for (int i = 0; i < 2; i++) {

    const int lit = lits[i];

    int highest_position = i;
    int highest_literal = lit;
    int highest_level = var (highest_literal).level;

    for (int j = i + 1; j < size; j++) {
      const int other = lits[j];
      const int tmp = var (other).level;
      if (highest_level >= tmp)
        continue;
      highest_literal = other;
      highest_position = j;
      highest_level = tmp;
      if (highest_level == res)
        break;
    }

    // No unwatched higher assignment level literal.
    //
    if (highest_position == i)
      continue;

    if (highest_position > 1) {
      LOG (conflict, "unwatch %d in", lit);
      remove_watch (watches (lit), conflict);
    }

    lits[highest_position] = lit;
    lits[i] = highest_literal;

    if (highest_position > 1)
      watch_literal (highest_literal, lits[!i], conflict);
  }

  // Only if the number of highest level literals in the conflict is one
  // then we can reuse the conflict clause as driving clause for 'forced'.
  //
  if (count != 1)
    forced = 0;

  return res;
}